

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp.c
# Opt level: O3

uint32 fe_warp_n_param(melfb_t *mel)

{
  switch(mel->warp_id) {
  case 0:
    return 1;
  case 1:
    return 2;
  case 2:
    return 2;
  }
  if (mel->warp_id == 0xffffffff) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
            ,0xbf,"fe_warp module must be configured w/ a valid ID\n");
  }
  else {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_warp.c"
            ,0xc4,"fe_warp module misconfigured with invalid fe_warp_id %u\n");
  }
  exit(1);
}

Assistant:

uint32
fe_warp_n_param(melfb_t *mel)
{
    if (mel->warp_id <= FE_WARP_ID_MAX) {
        return fe_warp_conf[mel->warp_id].n_param();
    }
    else if (mel->warp_id == FE_WARP_ID_NONE) {
        E_FATAL("fe_warp module must be configured w/ a valid ID\n");
    }
    else {
        E_FATAL
            ("fe_warp module misconfigured with invalid fe_warp_id %u\n",
             mel->warp_id);
    }

    return 0;
}